

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::AssignmentPatternExpressionSyntax::setChild
          (AssignmentPatternExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (index == 0) {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    this->type = (DataTypeSyntax *)pSVar1;
  }
  else {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->pattern).ptr = (AssignmentPatternSyntax *)pSVar1;
  }
  return;
}

Assistant:

void AssignmentPatternExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 1: pattern = child.node() ? &child.node()->as<AssignmentPatternSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}